

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Player * __thiscall World::Login(World *this,string *username,secure_string *password)

{
  LoginReply LVar1;
  World *this_00;
  string local_48;
  secure_string *local_28;
  secure_string *password_local;
  string *username_local;
  World *this_local;
  
  local_28 = password;
  password_local = (secure_string *)username;
  username_local = (string *)this;
  LVar1 = LoginCheck(this,username,password);
  if (LVar1 == LOGIN_WRONG_USERPASS) {
    this_local = (World *)0x0;
  }
  else {
    this_00 = (World *)operator_new(0x80);
    std::__cxx11::string::string((string *)&local_48,(string *)password_local);
    Player::Player((Player *)this_00,&local_48,this);
    this_local = this_00;
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (Player *)this_local;
}

Assistant:

Player *World::Login(const std::string& username, util::secure_string&& password)
{
	if (LoginCheck(username, std::move(password)) == LOGIN_WRONG_USERPASS)
		return 0;

	return new Player(username, this);
}